

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O0

void Centaurus::
     call_abs<void(*)(void*,int,void_const*,void_const*),asmjit::X86Gp,int,asmjit::X86Gp,asmjit::X86Gp>
               (X86Assembler *as,_func_void_void_ptr_int_void_ptr_void_ptr *addr,X86Gp *args,
               int args_1,X86Gp *args_2,X86Gp *args_3)

{
  uint32_t in_stack_fffffffffffffe4c;
  undefined8 this;
  undefined8 o0;
  undefined4 instId;
  undefined8 this_00;
  X86Gp *args_local_3;
  X86Gp *args_local_2;
  int args_local_1;
  X86Gp *args_local;
  _func_void_void_ptr_int_void_ptr_void_ptr *addr_local;
  X86Assembler *as_local;
  
  this_00 = (args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0];
  o0 = (args_2->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0];
  instId = (undefined4)
           ((ulong)*(undefined8 *)
                    ((long)&(args_2->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0 +
                    8) >> 0x20);
  this = *(undefined8 *)&(args_3->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0;
  push_arg<asmjit::X86Gp,int,asmjit::X86Gp,asmjit::X86Gp>
            (as,(X86Gp *)&stack0xfffffffffffffe70,args_1,(X86Gp *)&stack0xfffffffffffffe60,
             (X86Gp *)&stack0xfffffffffffffe50);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,in_stack_fffffffffffffe4c,(Operand_ *)0x163abe);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,in_stack_fffffffffffffe4c,(Operand_ *)0x163af8);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,in_stack_fffffffffffffe4c,(Operand_ *)0x163b32);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,in_stack_fffffffffffffe4c,(Operand_ *)0x163b6c);
  asmjit::CodeEmitter::emit((CodeEmitter *)this_00,instId,o0);
  return;
}

Assistant:

static void call_abs(asmjit::X86Assembler& as, T addr, Ts... args)
{
	push_arg(as, args...);
	if (sizeof...(args) >= 1) as.pop(ARG1_REG);
	if (sizeof...(args) >= 2) as.pop(ARG2_REG);
	if (sizeof...(args) >= 3) as.pop(ARG3_REG);
	if (sizeof...(args) >= 4) as.pop(ARG4_REG);
	
#if defined(CENTAURUS_BUILD_WINDOWS)
	as.sub(asmjit::x86::rsp, 32);
#endif
	as.call(reinterpret_cast<uint64_t>(addr));
#if defined(CENTAURUS_BUILD_WINDOWS)
	as.add(asmjit::x86::rsp, 32);
#endif
}